

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageAlphaPremultiply(Image *image)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Color *pCVar4;
  int i;
  long lVar5;
  float fVar6;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar4 = LoadImageColors(*image);
    iVar2 = image->width;
    iVar3 = image->height;
    for (lVar5 = 0; lVar5 < (long)iVar3 * (long)iVar2; lVar5 = lVar5 + 1) {
      bVar1 = pCVar4[lVar5].a;
      if (bVar1 != 0xff) {
        if (bVar1 == 0) {
          pCVar4[lVar5].r = '\0';
          pCVar4[lVar5].g = '\0';
          pCVar4[lVar5].b = '\0';
        }
        else {
          fVar6 = (float)bVar1 / 255.0;
          pCVar4[lVar5].r = (uchar)(int)((float)pCVar4[lVar5].r * fVar6);
          pCVar4[lVar5].g = (uchar)(int)((float)pCVar4[lVar5].g * fVar6);
          pCVar4[lVar5].b = (uchar)(int)((float)pCVar4[lVar5].b * fVar6);
        }
      }
    }
    free(image->data);
    iVar2 = image->format;
    image->data = pCVar4;
    image->format = 7;
    ImageFormat(image,iVar2);
    return;
  }
  return;
}

Assistant:

void ImageAlphaPremultiply(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    float alpha = 0.0f;
    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        if (pixels[i].a == 0)
        {
            pixels[i].r = 0;
            pixels[i].g = 0;
            pixels[i].b = 0;
        }
        else if (pixels[i].a < 255)
        {
            alpha = (float)pixels[i].a/255.0f;
            pixels[i].r = (unsigned char)((float)pixels[i].r*alpha);
            pixels[i].g = (unsigned char)((float)pixels[i].g*alpha);
            pixels[i].b = (unsigned char)((float)pixels[i].b*alpha);
        }
    }

    RL_FREE(image->data);

    int format = image->format;
    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}